

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaH_next(lua_State *L,Table *t,StkId key)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  TValue *o1_2;
  TValue *o2_2;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  TValue *i_o;
  int i;
  StkId in_stack_ffffffffffffffa8;
  Table *in_stack_ffffffffffffffb0;
  lua_State *in_stack_ffffffffffffffb8;
  int local_24;
  
  local_24 = findindex(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                      );
  do {
    iVar1 = local_24;
    local_24 = iVar1 + 1;
    if (*(int *)(in_RSI + 0x38) <= local_24) {
      local_24 = local_24 - *(int *)(in_RSI + 0x38);
      while( true ) {
        if ((int)(1L << (*(byte *)(in_RSI + 0xb) & 0x3f)) <= local_24) {
          return 0;
        }
        if (*(int *)(*(long *)(in_RSI + 0x20) + (long)local_24 * 0x28 + 8) != 0) break;
        local_24 = local_24 + 1;
      }
      lVar3 = *(long *)(in_RSI + 0x20) + (long)local_24 * 0x28;
      *in_RDX = *(double *)(lVar3 + 0x10);
      *(undefined4 *)(in_RDX + 1) = *(undefined4 *)(lVar3 + 0x18);
      pdVar2 = (double *)(*(long *)(in_RSI + 0x20) + (long)local_24 * 0x28);
      in_RDX[2] = *pdVar2;
      *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(pdVar2 + 1);
      return 1;
    }
  } while (*(int *)(*(long *)(in_RSI + 0x18) + (long)local_24 * 0x10 + 8) == 0);
  *in_RDX = (double)(iVar1 + 2);
  *(undefined4 *)(in_RDX + 1) = 3;
  pdVar2 = (double *)(*(long *)(in_RSI + 0x18) + (long)local_24 * 0x10);
  in_RDX[2] = *pdVar2;
  *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(pdVar2 + 1);
  return 1;
}

Assistant:

static int luaH_next(lua_State*L,Table*t,StkId key){
int i=findindex(L,t,key);
for(i++;i<t->sizearray;i++){
if(!ttisnil(&t->array[i])){
setnvalue(key,cast_num(i+1));
setobj(L,key+1,&t->array[i]);
return 1;
}
}
for(i-=t->sizearray;i<(int)sizenode(t);i++){
if(!ttisnil(gval(gnode(t,i)))){
setobj(L,key,key2tval(gnode(t,i)));
setobj(L,key+1,gval(gnode(t,i)));
return 1;
}
}
return 0;
}